

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O3

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>&,int&,int&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *head,int *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_4,int *tail_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_6)

{
  long lVar1;
  pointer pHVar2;
  HighFreqDataType *v;
  pointer this_00;
  size_type local_38;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_38,8);
  std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::resize(head,local_38);
  pHVar2 = (head->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (head->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pHVar2; this_00 = this_00 + 1)
  {
    HighFreqDataType::serialize<cereal::PortableBinaryInputArchive>
              (this_00,*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8));
  }
  PortableBinaryInputArchive::loadBinary<4ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail,4);
  PortableBinaryInputArchive::loadBinary<4ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_1,4);
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_38,8);
  std::__cxx11::string::resize((ulong)tail_2,(char)local_38);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8),(tail_2->_M_dataplus)._M_p,
             local_38);
  process<std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            (this,tail_3,tail_4,tail_5,tail_6);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }